

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void __thiscall gguf_kv::gguf_kv<unsigned_short>(gguf_kv *this,string *key,unsigned_short value)

{
  ulong uVar1;
  char *pcVar2;
  undefined2 in_DX;
  string *in_RSI;
  string *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  in_RDI[0x20] = (string)0x0;
  *(undefined4 *)(in_RDI + 0x24) = 2;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x1a07e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1a07fb);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    pcVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x1a087f);
    *(undefined2 *)pcVar2 = in_DX;
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,0x84,"GGML_ASSERT(%s) failed","!key.empty()");
}

Assistant:

gguf_kv(const std::string & key, const T value)
            : key(key), is_array(false), type(type_to_gguf_type<T>::value) {
        GGML_ASSERT(!key.empty());
        data.resize(sizeof(T));
        memcpy(data.data(), &value, sizeof(T));
    }